

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O3

int check_instid_ext_dep(lys_node *sleaf,char *json_instid)

{
  LYS_NODE LVar1;
  undefined8 in_RAX;
  lys_node *plVar2;
  char *pcVar3;
  size_t __n;
  lys_module *plVar4;
  lys_module *plVar5;
  int iVar6;
  undefined4 uVar7;
  undefined8 unaff_R13;
  lys_node *node;
  undefined8 local_38;
  int_log_opts prev_ilo;
  
  iVar6 = 0;
  if ((json_instid != (char *)0x0) && (iVar6 = 0, *json_instid != '\0')) {
    local_38 = in_RAX;
    plVar2 = lys_parent(sleaf);
    uVar7 = (undefined4)CONCAT71((int7)((ulong)unaff_R13 >> 8),1);
    do {
      node = plVar2;
      if (node == (lys_node *)0x0) {
        node = (lys_node *)0x0;
        goto LAB_0011b042;
      }
      LVar1 = node->nodetype;
      plVar2 = lys_parent(node);
    } while ((LVar1 & (LYS_ACTION|LYS_RPC|LYS_NOTIF)) == LYS_UNKNOWN);
    iVar6 = 1;
    if (plVar2 == (lys_node *)0x0) {
      uVar7 = 0;
LAB_0011b042:
      pcVar3 = strchr(json_instid + 1,0x2f);
      if (pcVar3 == (char *)0x0) {
        __n = strlen(json_instid);
      }
      else {
        __n = (long)pcVar3 - (long)json_instid;
      }
      pcVar3 = strndup(json_instid,__n);
      if (pcVar3 != (char *)0x0) {
        local_38 = CONCAT44(uVar7,(int_log_opts)local_38);
        ly_ilo_change((ly_ctx *)0x0,ILO_IGNORE,(int_log_opts *)&local_38,(ly_err_item **)0x0);
        plVar2 = ly_ctx_get_node((ly_ctx *)0x0,sleaf,pcVar3,0);
        ly_ilo_restore((ly_ctx *)0x0,(int_log_opts)local_38,(ly_err_item *)0x0,0);
        free(pcVar3);
        if (plVar2 == (lys_node *)0x0) {
          return 1;
        }
        if (local_38._4_1_ == '\0') {
          if (node != plVar2) {
            return 1;
          }
        }
        else {
          plVar4 = lys_node_module(sleaf);
          plVar5 = lys_node_module(plVar2);
          if (plVar4 != plVar5) {
            return 1;
          }
        }
      }
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

static int
check_instid_ext_dep(const struct lys_node *sleaf, const char *json_instid)
{
    const struct lys_node *op_node, *first_node;
    enum int_log_opts prev_ilo;
    char *buf, *tmp;

    if (!json_instid || !json_instid[0]) {
        /* no/empty value */
        return 0;
    }

    for (op_node = lys_parent(sleaf);
         op_node && !(op_node->nodetype & (LYS_NOTIF | LYS_RPC | LYS_ACTION));
         op_node = lys_parent(op_node));

    if (op_node && lys_parent(op_node)) {
        /* nested operation - any absolute path is external */
        return 1;
    }

    /* get the first node from the instid */
    tmp = strchr(json_instid + 1, '/');
    buf = strndup(json_instid, tmp ? (size_t)(tmp - json_instid) : strlen(json_instid));
    if (!buf) {
        /* so that we do not have to bother with logging, say it is not external */
        return 0;
    }

    /* find the first schema node, do not log */
    ly_ilo_change(NULL, ILO_IGNORE, &prev_ilo, NULL);
    first_node = ly_ctx_get_node(NULL, sleaf, buf, 0);
    ly_ilo_restore(NULL, prev_ilo, NULL, 0);

    free(buf);
    if (!first_node) {
        /* unknown path, say it is external */
        return 1;
    }

    /* based on the first schema node in the path we can decide whether it points to an external tree or not */

    if (op_node) {
        if (op_node != first_node) {
            /* it is a top-level operation, so we're good if it points somewhere inside it */
            return 1;
        }
    } else {
        if (lys_node_module(sleaf) != lys_node_module(first_node)) {
            /* modules differ */
            return 1;
        }
    }

    return 0;
}